

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

IndirOpnd * __thiscall IR::IndirOpnd::CloneUseInternal(IndirOpnd *this,Func *func)

{
  byte bVar1;
  undefined1 uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *baseOpnd;
  RegOpnd *indexOpnd;
  IndirOpnd *pIVar6;
  
  if ((this->super_Opnd).m_kind != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xa42,"(m_kind == OpndKindIndir)","m_kind == OpndKindIndir");
    if (!bVar4) goto LAB_00613884;
    *puVar5 = 0;
  }
  if (this->m_baseOpnd == (RegOpnd *)0x0) {
    baseOpnd = (RegOpnd *)0x0;
  }
  else {
    baseOpnd = (RegOpnd *)Opnd::CloneUse(&this->m_baseOpnd->super_Opnd,func);
    if ((baseOpnd->super_Opnd).m_kind != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_00613884;
      *puVar5 = 0;
    }
  }
  if (this->m_indexOpnd == (RegOpnd *)0x0) {
    indexOpnd = (RegOpnd *)0x0;
  }
  else {
    indexOpnd = (RegOpnd *)Opnd::CloneUse(&this->m_indexOpnd->super_Opnd,func);
    if ((indexOpnd->super_Opnd).m_kind != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
LAB_00613884:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  bVar1 = this->m_scale;
  pIVar6 = New(baseOpnd,indexOpnd,(this->super_Opnd).m_type,func);
  pIVar6->m_scale = bVar1;
  uVar2 = (this->super_Opnd).field_0xe;
  pIVar6->m_offset = this->m_offset;
  (pIVar6->super_Opnd).field_0xe = uVar2;
  pIVar6->m_addrKind = this->m_addrKind;
  pIVar6->m_originalAddress = this->m_originalAddress;
  return pIVar6;
}

Assistant:

IndirOpnd *
IndirOpnd::CloneUseInternal(Func *func)
{
    Assert(m_kind == OpndKindIndir);
    IndirOpnd * newOpnd;

    RegOpnd * newBaseOpnd = m_baseOpnd ? m_baseOpnd->CloneUse(func)->AsRegOpnd() : nullptr;
    RegOpnd * newIndexOpnd = m_indexOpnd ? m_indexOpnd->CloneUse(func)->AsRegOpnd() : nullptr;
    newOpnd = IndirOpnd::New(newBaseOpnd, newIndexOpnd, m_scale, m_type, func);

    newOpnd->SetOffset(m_offset, m_dontEncode);

#if DBG_DUMP
    newOpnd->m_addrKind = m_addrKind;
    newOpnd->m_originalAddress = m_originalAddress;
#endif
    return newOpnd;
}